

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cc
# Opt level: O2

void __thiscall RVO::RVOSimulator::~RVOSimulator(RVOSimulator *this)

{
  Agent *pAVar1;
  KdTree *this_00;
  pointer ppAVar2;
  pointer ppOVar3;
  Obstacle *this_01;
  size_t i_1;
  size_t i;
  ulong uVar4;
  
  pAVar1 = this->defaultAgent_;
  if (pAVar1 != (Agent *)0x0) {
    Agent::~Agent(pAVar1);
  }
  operator_delete(pAVar1);
  this_00 = this->kdTree_;
  if (this_00 != (KdTree *)0x0) {
    KdTree::~KdTree(this_00);
  }
  operator_delete(this_00);
  for (uVar4 = 0;
      ppAVar2 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->agents_).
                            super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppAVar2 >> 3);
      uVar4 = uVar4 + 1) {
    pAVar1 = ppAVar2[uVar4];
    if (pAVar1 != (Agent *)0x0) {
      Agent::~Agent(pAVar1);
    }
    operator_delete(pAVar1);
  }
  for (uVar4 = 0;
      ppOVar3 = (this->obstacles_).
                super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->obstacles_).
                            super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppOVar3 >> 3);
      uVar4 = uVar4 + 1) {
    this_01 = ppOVar3[uVar4];
    if (this_01 != (Obstacle *)0x0) {
      Obstacle::~Obstacle(this_01);
    }
    operator_delete(this_01);
  }
  std::_Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::~_Vector_base
            (&(this->obstacles_).
              super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>);
  std::_Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::~_Vector_base
            ((_Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_> *)this);
  return;
}

Assistant:

RVOSimulator::~RVOSimulator() {
  delete defaultAgent_;
  delete kdTree_;

  for (std::size_t i = 0U; i < agents_.size(); ++i) {
    delete agents_[i];
  }

  for (std::size_t i = 0U; i < obstacles_.size(); ++i) {
    delete obstacles_[i];
  }
}